

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.c
# Opt level: O0

int linenoiseEditStart(linenoiseState *l,int stdin_fd,int stdout_fd,char *buf,size_t buflen,
                      char *prompt)

{
  int iVar1;
  size_t sVar2;
  ssize_t sVar3;
  char *prompt_local;
  size_t buflen_local;
  char *buf_local;
  int stdout_fd_local;
  int stdin_fd_local;
  linenoiseState *l_local;
  
  buf_local._4_4_ = stdin_fd;
  if (stdin_fd == -1) {
    buf_local._4_4_ = 0;
  }
  buf_local._0_4_ = stdout_fd;
  if (stdout_fd == -1) {
    buf_local._0_4_ = 1;
  }
  l->in_completion = 0;
  l->ifd = buf_local._4_4_;
  l->ofd = (int)buf_local;
  l->buf = buf;
  l->buflen = buflen;
  l->prompt = prompt;
  sVar2 = strlen(prompt);
  l->plen = sVar2;
  l->pos = 0;
  l->oldcolpos = 0;
  l->oldcollen = 0;
  l->len = 0;
  iVar1 = enableRawMode(l->ifd);
  if (iVar1 == -1) {
    l_local._4_4_ = -1;
  }
  else {
    iVar1 = getColumns(buf_local._4_4_,(int)buf_local);
    l->cols = (long)iVar1;
    l->oldrows = 0;
    l->history_index = 0;
    l->prev_history_index = 0;
    *l->buf = '\0';
    l->buflen = l->buflen - 1;
    iVar1 = isatty(l->ifd);
    if (iVar1 == 0) {
      l_local._4_4_ = 0;
    }
    else {
      linenoiseHistoryAdd("");
      sVar3 = write(l->ofd,prompt,l->plen);
      if (sVar3 == -1) {
        l_local._4_4_ = -1;
      }
      else {
        l_local._4_4_ = 0;
      }
    }
  }
  return l_local._4_4_;
}

Assistant:

int linenoiseEditStart(struct linenoiseState *l, int stdin_fd, int stdout_fd, char *buf, size_t buflen, const char *prompt) {
    if (stdin_fd == -1) stdin_fd = STDIN_FILENO;
    if (stdout_fd == -1) stdout_fd = STDOUT_FILENO;

    /* Populate the linenoise state that we pass to functions implementing
     * specific editing functionalities. */
    l->in_completion = 0;
    l->ifd = stdin_fd;
    l->ofd = stdout_fd;
    l->buf = buf;
    l->buflen = buflen;
    l->prompt = prompt;
    l->plen = strlen(prompt);
    l->oldcolpos = l->pos = 0;
    l->oldcollen = 0;
    l->len = 0;

    /* Enter raw mode. */
    if (enableRawMode(l->ifd) == -1) return -1;

    l->cols = getColumns(stdin_fd, stdout_fd);
    l->oldrows = 0;
    l->history_index = 0;
    l->prev_history_index = 0;

    /* Buffer starts empty. */
    l->buf[0] = '\0';
    l->buflen--; /* Make sure there is always space for the nulterm */

    /* If stdin is not a tty, stop here with the initialization. We
     * will actually just read a line from standard input in blocking
     * mode later, in linenoiseEditFeed(). */
    if (!isatty(l->ifd)) return 0;

    /* The latest history entry is always our current buffer, that
     * initially is just an empty string. */
    linenoiseHistoryAdd("");

    if (write(l->ofd,prompt,l->plen) == -1) return -1;
    return 0;
}